

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::setFeatureEncoding
          (Result *__return_storage_ptr__,OneHotEncoder *this,
          vector<long,_std::allocator<long>_> *container)

{
  int64 value;
  bool bVar1;
  element_type *this_00;
  OneHotEncoder *this_01;
  reference plVar2;
  Int64Vector *this_02;
  long element;
  const_iterator __end1;
  const_iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  OneHotEncoder *ohe;
  vector<long,_std::allocator<long>_> *container_local;
  OneHotEncoder *this_local;
  
  this_00 = std::
            __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&(this->super_Model).m_spec);
  this_01 = Specification::Model::mutable_onehotencoder(this_00);
  Specification::OneHotEncoder::clear_int64categories(this_01);
  __end1 = std::vector<long,_std::allocator<long>_>::begin(container);
  element = (long)std::vector<long,_std::allocator<long>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>
                                *)&element);
    if (!bVar1) break;
    plVar2 = __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&__end1);
    value = *plVar2;
    this_02 = Specification::OneHotEncoder::mutable_int64categories(this_01);
    Specification::Int64Vector::add_vector(this_02,value);
    __gnu_cxx::__normal_iterator<const_long_*,_std::vector<long,_std::allocator<long>_>_>::
    operator++(&__end1);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::setFeatureEncoding(const std::vector<int64_t>& container) {
        auto ohe = m_spec->mutable_onehotencoder();
        ohe->clear_int64categories();

        for (auto element : container) {
            ohe->mutable_int64categories()->add_vector(element);
        }
        return Result();
    }